

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

ReturnAction<ot::commissioner::Error> __thiscall
testing::Return<ot::commissioner::Error>(testing *this,Error *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ReturnAction<ot::commissioner::Error> RVar1;
  undefined1 auStack_38 [40];
  
  ot::commissioner::Error::Error((Error *)auStack_38,value);
  internal::ReturnAction<ot::commissioner::Error>::ReturnAction
            ((ReturnAction<ot::commissioner::Error> *)this,(Error *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  RVar1.value_.super___shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  RVar1.value_.super___shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ReturnAction<ot::commissioner::Error>)
         RVar1.value_.super___shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(std::move(value));
}